

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O1

void benchmarks::SignalBenchmarks<descriptors::signal::boost::Regular>::Invoke
               (BenchmarkContext *context,int64_t numSlots)

{
  int64_t *piVar1;
  long lVar2;
  long lVar3;
  StorageArray<boost::signals2::scoped_connection> c;
  HandlerType handler;
  IOperationProfilerPtr op;
  SignalType s;
  StorageArray<boost::signals2::scoped_connection> local_98;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  anon_class_16_2_8e986c60 local_68;
  SignalType local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  local_38;
  
  lVar2 = context->_iterationsCount;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/boost.hpp:66:45)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/boost.hpp:66:45)>
             ::_M_manager;
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::signal(&local_38,(int)&local_68,(__sighandler_t)&local_98);
  local_98._size = numSlots;
  piVar1 = (int64_t *)operator_new__(-(ulong)((ulong)numSlots >> 0x3c != 0) | numSlots << 4 | 8);
  *piVar1 = numSlots;
  local_98._arr = (Storage<boost::signals2::scoped_connection> *)(piVar1 + 1);
  local_68.handler = (HandlerType *)&local_88;
  local_68.s = &local_38;
  StorageArray<boost::signals2::scoped_connection>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::boost::Regular>::Invoke(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            (&local_98,&local_68);
  local_68.s = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"invoke","");
  (*context->_vptr_BenchmarkContext[3])(&local_58._pimpl.pn,context,&local_68,numSlots * lVar2);
  if (local_68.s != &local_58) {
    operator_delete(local_68.s);
  }
  if (0 < lVar2) {
    do {
      boost::signals2::
      signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
      ::operator()(&local_38);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (0 < local_98._size) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      boost::signals2::scoped_connection::~scoped_connection
                ((scoped_connection *)((long)local_98._arr + lVar2));
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < local_98._size);
  }
  if (local_98._arr != (Storage<boost::signals2::scoped_connection> *)0x0) {
    operator_delete__((int64_t *)((long)local_98._arr + -8));
  }
  local_38.super_signal_base._vptr_signal_base = (_func_int **)&PTR__signal_00216fb0;
  boost::detail::shared_count::~shared_count(&local_38._pimpl.pn);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  return;
}

Assistant:

static void Invoke(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(numSlots);

            c.Construct([&]{ return s.connect(handler); });

            {
                auto op = context.Profile("invoke", numSlots * n);
                for (int64_t i = 0; i < n; ++i)
                    s();
            }

            c.Destruct();
        }